

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O2

void __thiscall
iutest::detail::TestInstance<iu_MatcherFailure_x_iutest_x_NanSensitiveFloatNear_Test>::TestInstance
          (TestInstance<iu_MatcherFailure_x_iutest_x_NanSensitiveFloatNear_Test> *this,
          string *testsuite,char *name,TestTypeId id,SetUpMethod setup,TearDownMethod teardown)

{
  TestSuite *pTVar1;
  UnitTest *this_00;
  allocator<char> local_39;
  string local_38;
  
  pTVar1 = AddTestSuite(this,testsuite,id,setup,teardown);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar1;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_00225040;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_38,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_38);
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_00226e28;
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo
            (&this_00->super_UnitTestImpl,(this->m_mediator).super_iuITestSuiteMediator.m_test_suite
             ,&this->m_info);
  return;
}

Assistant:

TestInstance(const ::std::string& testsuite, const char* name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown)
        : m_mediator(AddTestSuite(testsuite, id, setup, teardown))
        , m_info(&m_mediator, name, &m_factory)
    {
        UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
    }